

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

_Bool iter_advance_n_bytes(bfy_iter *iter,size_t n)

{
  _Bool _Var1;
  bfy_iovec bVar2;
  void *local_30;
  size_t local_28;
  ulong local_20;
  size_t n_local;
  bfy_iter *iter_local;
  
  local_20 = n;
  do {
    if (local_20 <= (iter->io).iov_len) {
      bVar2 = iov_drain(iter->io,local_20);
      local_30 = bVar2.iov_base;
      (iter->io).iov_base = local_30;
      local_28 = bVar2.iov_len;
      (iter->io).iov_len = local_28;
      (iter->cur).page_pos = local_20 + (iter->cur).page_pos;
      (iter->cur).content_pos = local_20 + (iter->cur).content_pos;
      return true;
    }
    local_20 = local_20 - (iter->io).iov_len;
    _Var1 = iter_next_page(iter);
  } while (_Var1);
  return false;
}

Assistant:

static bool
iter_advance_n_bytes(struct bfy_iter* const iter, size_t n) {
    while (iter->io.iov_len < n) { // make sure we're on the right page
        n -= iter->io.iov_len;
        if (!iter_next_page(iter)) {
            return false;
        }
    }
    iter->io = iov_drain(iter->io, n);
    iter->cur.page_pos += n;
    iter->cur.content_pos += n;
    return true;
}